

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_cohomology_unit_test.cpp
# Opt level: O1

void test_persistence_with_coeff_field(int coeff_field)

{
  char cVar1;
  ostream *poVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint __uval;
  uint __val;
  uint uVar7;
  uint uVar8;
  string str_persistence;
  string value9;
  string value8;
  string value7;
  string value6;
  string value5;
  string value4;
  string value3;
  string value2;
  string value1;
  string value0;
  string local_958;
  undefined1 local_938;
  undefined8 local_930;
  shared_count sStack_928;
  char *local_920;
  char *local_918;
  string local_910;
  long *local_8f0 [2];
  long local_8e0 [2];
  long *local_8d0 [2];
  long local_8c0 [2];
  long *local_8b0 [2];
  long local_8a0 [2];
  long *local_890 [2];
  long local_880 [2];
  long *local_870 [2];
  long local_860 [2];
  long *local_850 [2];
  long local_840 [2];
  long *local_830 [2];
  long local_820 [2];
  long *local_810 [2];
  long local_800 [2];
  long *local_7f0 [2];
  long local_7e0 [2];
  long *local_7d0 [2];
  long local_7c0 [2];
  char *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  undefined1 *local_5f0;
  undefined1 *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_7d0[0] = local_7c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7d0,"  0 0.02 1.12","");
  local_7f0[0] = local_7e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7f0,"  0 0.03 1.13","");
  local_810[0] = local_800;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_810,"  0 0.04 1.14","");
  local_830[0] = local_820;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_830,"  0 0.05 1.15","");
  local_850[0] = local_840;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_850,"  0 0.06 1.16","");
  local_870[0] = local_860;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_870,"  0 0.07 1.17","");
  local_890[0] = local_880;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_890,"  0 0.08 1.18","");
  local_8b0[0] = local_8a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8b0,"  0 0.09 1.19","");
  local_8d0[0] = local_8c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8d0,"  0 0 inf","");
  local_8f0[0] = local_8e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8f0,"  0 0.01 inf","");
  __val = -coeff_field;
  if (0 < coeff_field) {
    __val = coeff_field;
  }
  uVar7 = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar8 = 4;
    do {
      uVar7 = uVar8;
      uVar4 = (uint)uVar6;
      if (uVar4 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_001054fe;
      }
      if (uVar4 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_001054fe;
      }
      if (uVar4 < 10000) goto LAB_001054fe;
      uVar6 = uVar6 / 10000;
      uVar8 = uVar7 + 4;
    } while (99999 < uVar4);
    uVar7 = uVar7 + 1;
  }
LAB_001054fe:
  uVar8 = -(coeff_field >> 0x1f);
  cVar1 = (char)uVar8;
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_958,(char)uVar7 + cVar1);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_958._M_dataplus._M_p + uVar8,uVar7,__val);
  std::__cxx11::string::replace((ulong)local_7d0,0,(char *)0x0,(ulong)local_958._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
  }
  uVar7 = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar4 = 4;
    do {
      uVar7 = uVar4;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_001055c1;
      }
      if (uVar5 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_001055c1;
      }
      if (uVar5 < 10000) goto LAB_001055c1;
      uVar6 = uVar6 / 10000;
      uVar4 = uVar7 + 4;
    } while (99999 < uVar5);
    uVar7 = uVar7 + 1;
  }
LAB_001055c1:
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_958,(char)uVar7 + cVar1);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_958._M_dataplus._M_p + uVar8,uVar7,__val);
  std::__cxx11::string::replace((ulong)local_7f0,0,(char *)0x0,(ulong)local_958._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
  }
  uVar7 = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar4 = 4;
    do {
      uVar7 = uVar4;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_00105679;
      }
      if (uVar5 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_00105679;
      }
      if (uVar5 < 10000) goto LAB_00105679;
      uVar6 = uVar6 / 10000;
      uVar4 = uVar7 + 4;
    } while (99999 < uVar5);
    uVar7 = uVar7 + 1;
  }
LAB_00105679:
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_958,(char)uVar7 + cVar1);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_958._M_dataplus._M_p + uVar8,uVar7,__val);
  std::__cxx11::string::replace((ulong)local_810,0,(char *)0x0,(ulong)local_958._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
  }
  uVar7 = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar4 = 4;
    do {
      uVar7 = uVar4;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_00105731;
      }
      if (uVar5 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_00105731;
      }
      if (uVar5 < 10000) goto LAB_00105731;
      uVar6 = uVar6 / 10000;
      uVar4 = uVar7 + 4;
    } while (99999 < uVar5);
    uVar7 = uVar7 + 1;
  }
LAB_00105731:
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_958,(char)uVar7 + cVar1);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_958._M_dataplus._M_p + uVar8,uVar7,__val);
  std::__cxx11::string::replace((ulong)local_830,0,(char *)0x0,(ulong)local_958._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
  }
  uVar7 = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar4 = 4;
    do {
      uVar7 = uVar4;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_001057e9;
      }
      if (uVar5 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_001057e9;
      }
      if (uVar5 < 10000) goto LAB_001057e9;
      uVar6 = uVar6 / 10000;
      uVar4 = uVar7 + 4;
    } while (99999 < uVar5);
    uVar7 = uVar7 + 1;
  }
LAB_001057e9:
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_958,(char)uVar7 + cVar1);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_958._M_dataplus._M_p + uVar8,uVar7,__val);
  std::__cxx11::string::replace((ulong)local_850,0,(char *)0x0,(ulong)local_958._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
  }
  uVar7 = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar4 = 4;
    do {
      uVar7 = uVar4;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_001058a1;
      }
      if (uVar5 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_001058a1;
      }
      if (uVar5 < 10000) goto LAB_001058a1;
      uVar6 = uVar6 / 10000;
      uVar4 = uVar7 + 4;
    } while (99999 < uVar5);
    uVar7 = uVar7 + 1;
  }
LAB_001058a1:
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_958,(char)uVar7 + cVar1);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_958._M_dataplus._M_p + uVar8,uVar7,__val);
  std::__cxx11::string::replace((ulong)local_870,0,(char *)0x0,(ulong)local_958._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
  }
  uVar7 = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar4 = 4;
    do {
      uVar7 = uVar4;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_00105959;
      }
      if (uVar5 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_00105959;
      }
      if (uVar5 < 10000) goto LAB_00105959;
      uVar6 = uVar6 / 10000;
      uVar4 = uVar7 + 4;
    } while (99999 < uVar5);
    uVar7 = uVar7 + 1;
  }
LAB_00105959:
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_958,(char)uVar7 + cVar1);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_958._M_dataplus._M_p + uVar8,uVar7,__val);
  std::__cxx11::string::replace((ulong)local_890,0,(char *)0x0,(ulong)local_958._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
  }
  uVar7 = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar4 = 4;
    do {
      uVar7 = uVar4;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_00105a11;
      }
      if (uVar5 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_00105a11;
      }
      if (uVar5 < 10000) goto LAB_00105a11;
      uVar6 = uVar6 / 10000;
      uVar4 = uVar7 + 4;
    } while (99999 < uVar5);
    uVar7 = uVar7 + 1;
  }
LAB_00105a11:
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_958,(char)uVar7 + cVar1);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_958._M_dataplus._M_p + uVar8,uVar7,__val);
  std::__cxx11::string::replace((ulong)local_8b0,0,(char *)0x0,(ulong)local_958._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
  }
  uVar7 = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar4 = 4;
    do {
      uVar7 = uVar4;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_00105ac9;
      }
      if (uVar5 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_00105ac9;
      }
      if (uVar5 < 10000) goto LAB_00105ac9;
      uVar6 = uVar6 / 10000;
      uVar4 = uVar7 + 4;
    } while (99999 < uVar5);
    uVar7 = uVar7 + 1;
  }
LAB_00105ac9:
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_958,(char)uVar7 + cVar1);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_958._M_dataplus._M_p + uVar8,uVar7,__val);
  std::__cxx11::string::replace((ulong)local_8d0,0,(char *)0x0,(ulong)local_958._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
  }
  uVar7 = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar4 = 4;
    do {
      uVar7 = uVar4;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_00105b81;
      }
      if (uVar5 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_00105b81;
      }
      if (uVar5 < 10000) goto LAB_00105b81;
      uVar6 = uVar6 / 10000;
      uVar4 = uVar7 + 4;
    } while (99999 < uVar5);
    uVar7 = uVar7 + 1;
  }
LAB_00105b81:
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_958,cVar1 + (char)uVar7);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_958._M_dataplus._M_p + uVar8,uVar7,__val);
  std::__cxx11::string::replace((ulong)local_8f0,0,(char *)0x0,(ulong)local_958._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "********************************************************************",0x44);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=",0x37);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,coeff_field);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," MIN_PERS=0",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  test_persistence_abi_cxx11_(&local_958,coeff_field,0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::clog,local_958._M_dataplus._M_p,local_958._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x55);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_7d0[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value0) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_58 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x56);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_7f0[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value1) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_88 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x57);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_810[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value2) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_b8 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x58);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_830[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value3) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_e8 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x59);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_850[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value4) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_118 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x5a);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_870[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value5) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_148 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x5b);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_890[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value6) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_178 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x5c);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_8b0[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value7) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_1a8 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x5d);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_8d0[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value8) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_1d8 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x5e);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_8f0[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value9) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_208 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"str_persistence=",0x10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::clog,local_958._M_dataplus._M_p,local_958._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "********************************************************************",0x44);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=",0x37);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,coeff_field);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," MIN_PERS=1",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  test_persistence_abi_cxx11_(&local_910,coeff_field,1);
  std::__cxx11::string::operator=((string *)&local_958,(string *)&local_910);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910._M_dataplus._M_p != &local_910.field_2) {
    operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
  }
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x66);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_7d0[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value0) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_238 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x67);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_7f0[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value1) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_268 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x68);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_810[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value2) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_298 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x69);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_830[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value3) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_2c8 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x6a);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_850[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value4) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_2f8 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x6b);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_870[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value5) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_328 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0x6c);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_890[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value6) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_358 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_370,0x6d);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_8b0[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value7) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_388 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a0,0x6e);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_8d0[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value8) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_3b8 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d0,0x6f);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_8f0[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value9) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_3e8 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"str_persistence=",0x10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::clog,local_958._M_dataplus._M_p,local_958._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "********************************************************************",0x44);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=",0x37);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,coeff_field);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," MIN_PERS=2",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  test_persistence_abi_cxx11_(&local_910,coeff_field,2);
  std::__cxx11::string::operator=((string *)&local_958,(string *)&local_910);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910._M_dataplus._M_p != &local_910.field_2) {
    operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
  }
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_400,0x77);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_7d0[0],0);
  local_938 = lVar3 == -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value0) == std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_418 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_430,0x78);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_7f0[0],0);
  local_938 = lVar3 == -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value1) == std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_448 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_460,0x79);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_810[0],0);
  local_938 = lVar3 == -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value2) == std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_478 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_490,0x7a);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_830[0],0);
  local_938 = lVar3 == -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value3) == std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_4a8 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4c0,0x7b);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_850[0],0);
  local_938 = lVar3 == -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value4) == std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_4d8 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4f0,0x7c);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_870[0],0);
  local_938 = lVar3 == -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value5) == std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_508 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_520,0x7d);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_890[0],0);
  local_938 = lVar3 == -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value6) == std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_538 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_550,0x7e);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_8b0[0],0);
  local_938 = lVar3 == -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value7) == std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_570 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_568 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_578 = "";
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_580,0x7f);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_8d0[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value8) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_5a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_598 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_5a8 = "";
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5b0,0x80);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_8f0[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value9) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_5d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_5c8 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"str_persistence=",0x10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::clog,local_958._M_dataplus._M_p,local_958._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "********************************************************************",0x44);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=",0x37);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,coeff_field);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," MIN_PERS=Inf",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  test_persistence_abi_cxx11_(&local_910,coeff_field,0x7fffffff);
  std::__cxx11::string::operator=((string *)&local_958,(string *)&local_910);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910._M_dataplus._M_p != &local_910.field_2) {
    operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
  }
  local_5e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_5d8 = "";
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5e0,0x88);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_7d0[0],0);
  local_938 = lVar3 == -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value0) == std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_600 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_5f8 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_610 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_610,0x89);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_7f0[0],0);
  local_938 = lVar3 == -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value1) == std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_630 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_628 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_638 = "";
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_640,0x8a);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_810[0],0);
  local_938 = lVar3 == -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value2) == std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_660 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_658 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_668 = "";
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_670,0x8b);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_830[0],0);
  local_938 = lVar3 == -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value3) == std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_688 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_698 = "";
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_6a0,0x8c);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_850[0],0);
  local_938 = lVar3 == -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value4) == std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_6c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_6b8 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_6c8 = "";
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_6d0,0x8d);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_870[0],0);
  local_938 = lVar3 == -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value5) == std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_6f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_6e8 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_700 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_6f8 = "";
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_700,0x8e);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_890[0],0);
  local_938 = lVar3 == -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value6) == std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_720 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_718 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_730 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_728 = "";
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_730,0x8f);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_8b0[0],0);
  local_938 = lVar3 == -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value7) == std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_750 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_748 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_760 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_758 = "";
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_760,0x90);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_8d0[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value8) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_778 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  local_790 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_788 = "";
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_790,0x91);
  lVar3 = std::__cxx11::string::find((char *)&local_958,(ulong)local_8f0[0],0);
  local_938 = lVar3 != -1;
  local_930 = 0;
  sStack_928.pi_ = (sp_counted_base *)0x0;
  local_920 = "str_persistence.find(value9) != std::string::npos";
  local_918 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001249f8;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_7b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_7a8 = "";
  local_910.field_2._8_8_ = &local_920;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_928);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"str_persistence=",0x10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::clog,local_958._M_dataplus._M_p,local_958._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
  }
  if (local_8f0[0] != local_8e0) {
    operator_delete(local_8f0[0],local_8e0[0] + 1);
  }
  if (local_8d0[0] != local_8c0) {
    operator_delete(local_8d0[0],local_8c0[0] + 1);
  }
  if (local_8b0[0] != local_8a0) {
    operator_delete(local_8b0[0],local_8a0[0] + 1);
  }
  if (local_890[0] != local_880) {
    operator_delete(local_890[0],local_880[0] + 1);
  }
  if (local_870[0] != local_860) {
    operator_delete(local_870[0],local_860[0] + 1);
  }
  if (local_850[0] != local_840) {
    operator_delete(local_850[0],local_840[0] + 1);
  }
  if (local_830[0] != local_820) {
    operator_delete(local_830[0],local_820[0] + 1);
  }
  if (local_810[0] != local_800) {
    operator_delete(local_810[0],local_800[0] + 1);
  }
  if (local_7f0[0] != local_7e0) {
    operator_delete(local_7f0[0],local_7e0[0] + 1);
  }
  if (local_7d0[0] != local_7c0) {
    operator_delete(local_7d0[0],local_7c0[0] + 1);
  }
  return;
}

Assistant:

void test_persistence_with_coeff_field(int coeff_field) {
  std::string value0("  0 0.02 1.12");
  std::string value1("  0 0.03 1.13");
  std::string value2("  0 0.04 1.14");
  std::string value3("  0 0.05 1.15");
  std::string value4("  0 0.06 1.16");
  std::string value5("  0 0.07 1.17");
  std::string value6("  0 0.08 1.18");
  std::string value7("  0 0.09 1.19");
  std::string value8("  0 0 inf"    );
  std::string value9("  0 0.01 inf" );

  value0.insert(0,std::to_string(coeff_field));
  value1.insert(0,std::to_string(coeff_field));
  value2.insert(0,std::to_string(coeff_field));
  value3.insert(0,std::to_string(coeff_field));
  value4.insert(0,std::to_string(coeff_field));
  value5.insert(0,std::to_string(coeff_field));
  value6.insert(0,std::to_string(coeff_field));
  value7.insert(0,std::to_string(coeff_field));
  value8.insert(0,std::to_string(coeff_field));
  value9.insert(0,std::to_string(coeff_field));

  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=" << coeff_field << " MIN_PERS=0" << std::endl;

  std::string str_persistence = test_persistence(coeff_field, 0);
  std::clog << str_persistence << std::endl;
  
  BOOST_CHECK(str_persistence.find(value0) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value1) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value2) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value3) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value4) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value5) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value6) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value7) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value8) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value9) != std::string::npos); // Check found
  std::clog << "str_persistence=" << str_persistence << std::endl;

  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=" << coeff_field << " MIN_PERS=1" << std::endl;

  str_persistence = test_persistence(coeff_field, 1);

  BOOST_CHECK(str_persistence.find(value0) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value1) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value2) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value3) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value4) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value5) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value6) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value7) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value8) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value9) != std::string::npos); // Check found
  std::clog << "str_persistence=" << str_persistence << std::endl;

  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=" << coeff_field << " MIN_PERS=2" << std::endl;

  str_persistence = test_persistence(coeff_field, 2);

  BOOST_CHECK(str_persistence.find(value0) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value1) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value2) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value3) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value4) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value5) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value6) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value7) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value8) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value9) != std::string::npos); // Check found
  std::clog << "str_persistence=" << str_persistence << std::endl;

  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=" << coeff_field << " MIN_PERS=Inf" << std::endl;

  str_persistence = test_persistence(coeff_field, (std::numeric_limits<int>::max)());

  BOOST_CHECK(str_persistence.find(value0) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value1) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value2) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value3) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value4) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value5) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value6) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value7) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value8) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value9) != std::string::npos); // Check found
  std::clog << "str_persistence=" << str_persistence << std::endl;
}